

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O0

Vec_Vec_t * Ivy_ManLevelize(Ivy_Man_t *p)

{
  int iVar1;
  Vec_Vec_t *p_00;
  Ivy_Obj_t *pObj_00;
  int local_24;
  int i;
  Ivy_Obj_t *pObj;
  Vec_Vec_t *vNodes;
  Ivy_Man_t *p_local;
  
  p_00 = Vec_VecAlloc(100);
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_24) {
      return p_00;
    }
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (pObj_00 != (Ivy_Obj_t *)0x0) {
      iVar1 = Ivy_ObjIsBuf(pObj_00);
      if (iVar1 != 0) {
        __assert_fail("!Ivy_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                      ,0xe8,"Vec_Vec_t *Ivy_ManLevelize(Ivy_Man_t *)");
      }
      iVar1 = Ivy_ObjIsNode(pObj_00);
      if (iVar1 != 0) {
        Vec_VecPush(p_00,*(uint *)&pObj_00->field_0x8 >> 0xb,pObj_00);
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

Vec_Vec_t * Ivy_ManLevelize( Ivy_Man_t * p )
{
    Vec_Vec_t * vNodes;
    Ivy_Obj_t * pObj;
    int i;
    vNodes = Vec_VecAlloc( 100 );
    Ivy_ManForEachObj( p, pObj, i )
    {
        assert( !Ivy_ObjIsBuf(pObj) );
        if ( Ivy_ObjIsNode(pObj) )
            Vec_VecPush( vNodes, pObj->Level, pObj );
    }
    return vNodes;
}